

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::BindLogicalType
          (Binder *this,LogicalType *type,optional_ptr<duckdb::Catalog,_true> catalog,string *schema
          )

{
  bool bVar1;
  LogicalType local_40;
  
  bVar1 = TypeVisitor::Contains(type,USER);
  if (bVar1) {
    BindLogicalTypeInternal(&local_40,this,type,catalog,schema);
    LogicalType::operator=(type,&local_40);
    LogicalType::~LogicalType(&local_40);
  }
  return;
}

Assistant:

void Binder::BindLogicalType(LogicalType &type, optional_ptr<Catalog> catalog, const string &schema) {
	// check if we need to bind this type at all
	if (!TypeVisitor::Contains(type, LogicalTypeId::USER)) {
		return;
	}
	type = BindLogicalTypeInternal(type, catalog, schema);
}